

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O0

bool __thiscall
wallet::LegacyDataSPKM::GetPubKey(LegacyDataSPKM *this,CKeyID *address,CPubKey *vchPubKeyOut)

{
  long lVar1;
  byte bVar2;
  bool bVar3;
  const_iterator __x;
  reference ppVar4;
  FillableSigningProvider *in_RDX;
  long in_RDI;
  long in_FS_OFFSET;
  const_iterator mi;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock36;
  AnnotatedMixin<std::recursive_mutex> *in_stack_ffffffffffffff78;
  undefined6 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff86;
  undefined1 in_stack_ffffffffffffff87;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  LegacyDataSPKM *in_stack_ffffffffffffffb0;
  bool local_29;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>(in_stack_ffffffffffffff78);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_RDX,
             (AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffffb0,
             (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
             (char *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
             (int)((ulong)in_RDI >> 0x20),SUB81((ulong)in_RDI >> 0x18,0));
  bVar2 = (**(code **)(**(long **)(in_RDI + 8) + 0x48))();
  if ((bVar2 & 1) == 0) {
    bVar3 = FillableSigningProvider::GetPubKey
                      (in_RDX,(CKeyID *)in_stack_ffffffffffffffb0,
                       (CPubKey *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    if (bVar3) {
      local_29 = true;
    }
    else {
      local_29 = GetWatchPubKey(in_stack_ffffffffffffffb0,
                                (CKeyID *)
                                CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                                (CPubKey *)CONCAT17(bVar2,in_stack_ffffffffffffffa0));
    }
  }
  else {
    __x = std::
          map<CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
          ::find((map<CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                  *)CONCAT17(in_stack_ffffffffffffff87,
                             CONCAT16(in_stack_ffffffffffffff86,in_stack_ffffffffffffff80)),
                 (key_type *)in_stack_ffffffffffffff78);
    std::
    map<CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
    ::end((map<CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
           *)CONCAT17(in_stack_ffffffffffffff87,
                      CONCAT16(in_stack_ffffffffffffff86,in_stack_ffffffffffffff80)));
    bVar3 = std::operator==((_Self *)__x._M_node,
                            (_Self *)CONCAT17(in_stack_ffffffffffffff87,
                                              CONCAT16(in_stack_ffffffffffffff86,
                                                       in_stack_ffffffffffffff80)));
    if (((bVar3 ^ 0xffU) & 1) == 0) {
      local_29 = GetWatchPubKey(in_stack_ffffffffffffffb0,
                                (CKeyID *)
                                CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                                (CPubKey *)CONCAT17(bVar2,in_stack_ffffffffffffffa0));
    }
    else {
      ppVar4 = std::
               _Rb_tree_const_iterator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
               ::operator*((_Rb_tree_const_iterator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                            *)in_stack_ffffffffffffff78);
      memcpy(in_RDX,&ppVar4->second,0x41);
      local_29 = true;
    }
  }
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffff78);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_29;
  }
  __stack_chk_fail();
}

Assistant:

bool LegacyDataSPKM::GetPubKey(const CKeyID &address, CPubKey& vchPubKeyOut) const
{
    LOCK(cs_KeyStore);
    if (!m_storage.HasEncryptionKeys()) {
        if (!FillableSigningProvider::GetPubKey(address, vchPubKeyOut)) {
            return GetWatchPubKey(address, vchPubKeyOut);
        }
        return true;
    }

    CryptedKeyMap::const_iterator mi = mapCryptedKeys.find(address);
    if (mi != mapCryptedKeys.end())
    {
        vchPubKeyOut = (*mi).second.first;
        return true;
    }
    // Check for watch-only pubkeys
    return GetWatchPubKey(address, vchPubKeyOut);
}